

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O2

bool CNscPStackEntry::TestConstantEquality
               (uchar *pauchData1,size_t nDataSize1,uchar *pauchData2,size_t nDataSize2)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  
  bVar1 = true;
  if (nDataSize2 == 0 && nDataSize1 == 0) {
    return true;
  }
  if ((nDataSize1 == 0) != (nDataSize2 == 0)) {
    return false;
  }
  if (*(size_t *)pauchData1 != nDataSize1) {
    __assert_fail("ph1 ->nOpSize == nDataSize1",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x1eb,
                  "static bool CNscPStackEntry::TestConstantEquality(const unsigned char *, size_t, const unsigned char *, size_t)"
                 );
  }
  if (*(size_t *)pauchData2 != nDataSize2) {
    __assert_fail("ph2 ->nOpSize == nDataSize2",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x1ec,
                  "static bool CNscPStackEntry::TestConstantEquality(const unsigned char *, size_t, const unsigned char *, size_t)"
                 );
  }
  if (*(int *)(pauchData1 + 8) != 0x34) {
    __assert_fail("ph1 ->nOpCode == NscPCode_Constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x1ed,
                  "static bool CNscPStackEntry::TestConstantEquality(const unsigned char *, size_t, const unsigned char *, size_t)"
                 );
  }
  if (*(int *)(pauchData2 + 8) != 0x34) {
    __assert_fail("ph2 ->nOpCode == NscPCode_Constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x1ee,
                  "static bool CNscPStackEntry::TestConstantEquality(const unsigned char *, size_t, const unsigned char *, size_t)"
                 );
  }
  if (*(int *)(pauchData1 + 0xc) != *(int *)(pauchData2 + 0xc)) {
    return false;
  }
  switch(*(int *)(pauchData1 + 0xc)) {
  case 6:
  case 9:
    return *(int *)(pauchData1 + 0x10) == *(int *)(pauchData2 + 0x10);
  case 7:
    fVar3 = *(float *)(pauchData1 + 0x10) - *(float *)(pauchData2 + 0x10);
    break;
  case 8:
    if (*(size_t *)(pauchData1 + 0x10) != *(size_t *)(pauchData2 + 0x10)) {
      return false;
    }
    iVar2 = bcmp(pauchData1 + 0x18,pauchData2 + 0x18,*(size_t *)(pauchData1 + 0x10));
    return iVar2 == 0;
  case 10:
    if (1e-05 <= ABS(*(float *)(pauchData1 + 0x10) - *(float *)(pauchData2 + 0x10))) {
      return false;
    }
    if (1e-05 <= ABS(*(float *)(pauchData1 + 0x14) - *(float *)(pauchData2 + 0x14))) {
      return false;
    }
    fVar3 = *(float *)(pauchData1 + 0x18) - *(float *)(pauchData2 + 0x18);
    break;
  default:
    goto switchD_0015efe8_default;
  }
  bVar1 = ABS(fVar3) < 1e-05;
switchD_0015efe8_default:
  return bVar1;
}

Assistant:

static bool TestConstantEquality(const unsigned char *pauchData1, size_t nDataSize1,
		const unsigned char *pauchData2, size_t nDataSize2)
	{
		const NscPCodeHeader *ph1 = (const NscPCodeHeader *) pauchData1;
		const NscPCodeHeader *ph2 = (const NscPCodeHeader *) pauchData2;

		if (nDataSize1 == 0 && nDataSize2 == 0)
			return true;
		else if (nDataSize1 == 0 && nDataSize2 != 0)
			return false;
		else if (nDataSize2 == 0 && nDataSize1 != 0)
			return false;

		assert (ph1 ->nOpSize == nDataSize1);
		assert (ph2 ->nOpSize == nDataSize2);
		assert (ph1 ->nOpCode == NscPCode_Constant);
		assert (ph2 ->nOpCode == NscPCode_Constant);

		if (ph1 ->nType != ph2 ->nType)
			return false;

		switch (ph1 ->nType)
		{

		case NscType_Integer:
			{
				const NscPCodeConstantInteger *p1 = (const NscPCodeConstantInteger *) ph1;
				const NscPCodeConstantInteger *p2 = (const NscPCodeConstantInteger *) ph2;

				return (p1 ->lValue == p2 ->lValue);
			}

		case NscType_Float:
			{
				const NscPCodeConstantFloat *p1 = (const NscPCodeConstantFloat *) ph1;
				const NscPCodeConstantFloat *p2 = (const NscPCodeConstantFloat *) ph2;

				return fabs (p1 ->fValue - p2 ->fValue) < 0.00001f;
			}

		case NscType_String:
			{
				const NscPCodeConstantString *p1 = (const NscPCodeConstantString *) ph1;
				const NscPCodeConstantString *p2 = (const NscPCodeConstantString *) ph2;

				return (p1 ->nLength == p2 ->nLength &&
				        memcmp (p1 ->szString, p2 ->szString, p1 ->nLength) == 0);
			}

		case NscType_Object:
			{
				const NscPCodeConstantObject *p1 = (const NscPCodeConstantObject *) ph1;
				const NscPCodeConstantObject *p2 = (const NscPCodeConstantObject *) ph2;

				return (p1 ->ulid == p2 ->ulid);
			}

		case NscType_Vector:
			{
				const NscPCodeConstantVector *p1 = (const NscPCodeConstantVector *) ph1;
				const NscPCodeConstantVector *p2 = (const NscPCodeConstantVector *) ph2;

				return fabs (p1 ->v [0] - p2 ->v [0]) < 0.00001f &&
				       fabs (p1 ->v [1] - p2 ->v [1]) < 0.00001f &&
				       fabs (p1 ->v [2] - p2 ->v [2]) < 0.00001f;
			}

		default:
			//
			// Structure types, or others without value initializers.
			//

			return true;

		}
	}